

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixEnv::Schedule
          (PosixEnv *this,_func_void_void_ptr *background_work_function,void *background_work_arg)

{
  long lVar1;
  bool bVar2;
  _func_void_PosixEnv_ptr *in_RDX;
  thread *in_RSI;
  queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  thread background_thread;
  CondVar *in_stack_ffffffffffffffa8;
  _func_void_void_ptr **in_stack_ffffffffffffffb0;
  PosixEnv **in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::Lock((Mutex *)in_stack_ffffffffffffffa8);
  if (((ulong)in_RDI[1].c.
              super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first & 1) == 0) {
    *(undefined1 *)
     &in_RDI[1].c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = 1;
    in_stack_ffffffffffffffb0 = (_func_void_void_ptr **)&stack0xffffffffffffffe0;
    std::thread::
    thread<void(&)(leveldb::(anonymous_namespace)::PosixEnv*),leveldb::(anonymous_namespace)::PosixEnv*,void>
              (in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    std::thread::detach();
    std::thread::~thread((thread *)in_stack_ffffffffffffffa8);
  }
  bVar2 = std::
          queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
          ::empty((queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
                   *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    port::CondVar::Signal(in_stack_ffffffffffffffa8);
  }
  std::
  queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>>>
  ::emplace<void(*&)(void*),void*&>
            (in_RDI,in_stack_ffffffffffffffb0,(void **)in_stack_ffffffffffffffa8);
  port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PosixEnv::Schedule(
    void (*background_work_function)(void* background_work_arg),
    void* background_work_arg) {
  background_work_mutex_.Lock();

  // Start the background thread, if we haven't done so already.
  if (!started_background_thread_) {
    started_background_thread_ = true;
    std::thread background_thread(PosixEnv::BackgroundThreadEntryPoint, this);
    background_thread.detach();
  }

  // If the queue is empty, the background thread may be waiting for work.
  if (background_work_queue_.empty()) {
    background_work_cv_.Signal();
  }

  background_work_queue_.emplace(background_work_function, background_work_arg);
  background_work_mutex_.Unlock();
}